

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_cursor.hpp
# Opt level: O0

void __thiscall
jsoncons::cbor::basic_cbor_cursor<jsoncons::bytes_source,std::allocator<char>>::
basic_cbor_cursor<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
          (basic_cbor_cursor<jsoncons::bytes_source,_std::allocator<char>_> *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *source,error_code *ec)

{
  undefined8 in_RDX;
  undefined8 in_RSI;
  basic_cbor_cursor<jsoncons::bytes_source,_std::allocator<char>_> *in_RDI;
  cbor_decode_options *this_00;
  undefined1 local_38 [30];
  cbor_decode_options local_1a;
  
  this_00 = &local_1a;
  local_1a._2_8_ = in_RDX;
  local_1a._10_8_ = in_RSI;
  std::allocator<char>::allocator();
  cbor_decode_options::cbor_decode_options(this_00);
  basic_cbor_cursor<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
            (in_RDI,this_00,local_1a._10_8_,local_38,local_1a._2_8_);
  cbor_decode_options::~cbor_decode_options(this_00);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  return;
}

Assistant:

basic_cbor_cursor(Sourceable&& source, 
        std::error_code& ec)
        : basic_cbor_cursor(std::allocator_arg, Allocator(),
              std::forward<Sourceable>(source), 
              cbor_decode_options(), 
              ec)
    {
    }